

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::OutOfLinePrintString<absl::lts_20250127::Hex>
               (BaseTextGenerator *generator,Hex *values)

{
  string local_78;
  StringifySink local_58;
  string_view local_38 [3];
  
  local_58.buffer_._M_dataplus._M_p = (pointer)&local_58.buffer_.field_2;
  local_58.buffer_.field_2._M_allocated_capacity = 0;
  local_58.buffer_.field_2._8_8_ = 0;
  local_58.buffer_._M_string_length = 0;
  local_38[0] = absl::lts_20250127::strings_internal::
                ExtractStringification<absl::lts_20250127::Hex>(&local_58,values);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_78,(lts_20250127 *)local_38,(AlphaNum *)local_38[0]._M_str);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}